

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

float __thiscall Imath_2_5::Vec4<float>::lengthTiny(Vec4<float> *this)

{
  float *in_RDI;
  double dVar1;
  float max;
  float absW;
  float absZ;
  float absY;
  float absX;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_24;
  float local_4;
  
  if (*in_RDI < 0.0) {
    local_34 = -*in_RDI;
  }
  else {
    local_34 = *in_RDI;
  }
  if (in_RDI[1] < 0.0) {
    local_38 = -in_RDI[1];
  }
  else {
    local_38 = in_RDI[1];
  }
  if (in_RDI[2] < 0.0) {
    local_3c = -in_RDI[2];
  }
  else {
    local_3c = in_RDI[2];
  }
  if (in_RDI[3] < 0.0) {
    local_40 = -in_RDI[3];
  }
  else {
    local_40 = in_RDI[3];
  }
  local_24 = local_34;
  if (local_34 < local_38) {
    local_24 = local_38;
  }
  if (local_24 < local_3c) {
    local_24 = local_3c;
  }
  if (local_24 < local_40) {
    local_24 = local_40;
  }
  if ((local_24 != 0.0) || (NAN(local_24))) {
    dVar1 = Math<float>::sqrt((double)(ulong)(uint)((local_40 / local_24) * (local_40 / local_24) +
                                                   (local_3c / local_24) * (local_3c / local_24) +
                                                   (local_34 / local_24) * (local_34 / local_24) +
                                                   (local_38 / local_24) * (local_38 / local_24)));
    local_4 = local_24 * SUB84(dVar1,0);
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

T
Vec4<T>::lengthTiny () const
{
    T absX = (x >= T (0))? x: -x;
    T absY = (y >= T (0))? y: -y;
    T absZ = (z >= T (0))? z: -z;
    T absW = (w >= T (0))? w: -w;
    
    T max = absX;

    if (max < absY)
        max = absY;

    if (max < absZ)
        max = absZ;

    if (max < absW)
        max = absW;

    if (max == T (0))
        return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;
    absZ /= max;
    absW /= max;

    return max *
        Math<T>::sqrt (absX * absX + absY * absY + absZ * absZ + absW * absW);
}